

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionEval.cpp
# Opt level: O0

ExprBase * EvaluateModule(ExpressionEvalContext *ctx,ExprModule *expression)

{
  StackFrame *pSVar1;
  StackFrame **ppSVar2;
  ExprBase *pEVar3;
  bool bVar4;
  ExprBase *local_38;
  ExprBase *value_1;
  ExprBase *value;
  StackFrame *frame;
  ExprModule *expression_local;
  ExpressionEvalContext *ctx_local;
  
  pSVar1 = ExpressionContext::get<ExpressionEvalContext::StackFrame>(ctx->ctx);
  ExpressionEvalContext::StackFrame::StackFrame(pSVar1,ctx->ctx->allocator,(FunctionData *)0x0);
  ctx->globalFrame = pSVar1;
  SmallArray<ExpressionEvalContext::StackFrame_*,_32U>::push_back
            (&ctx->stackFrames,&ctx->globalFrame);
  ppSVar2 = SmallArray<ExpressionEvalContext::StackFrame_*,_32U>::back(&ctx->stackFrames);
  pSVar1 = *ppSVar2;
  for (value_1 = (expression->setup).head; value_1 != (ExprBase *)0x0; value_1 = value_1->next) {
    pEVar3 = Evaluate(ctx,value_1);
    if (pEVar3 == (ExprBase *)0x0) {
      return (ExprBase *)0x0;
    }
  }
  local_38 = (expression->expressions).head;
  while( true ) {
    if (local_38 == (ExprBase *)0x0) {
      SmallArray<ExpressionEvalContext::StackFrame_*,_32U>::pop_back(&ctx->stackFrames);
      bVar4 = SmallArray<ExpressionEvalContext::StackFrame_*,_32U>::empty(&ctx->stackFrames);
      if (bVar4) {
        return (ExprBase *)0x0;
      }
      __assert_fail("ctx.stackFrames.empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                    ,0xc5b,"ExprBase *EvaluateModule(ExpressionEvalContext &, ExprModule *)");
    }
    pEVar3 = Evaluate(ctx,local_38);
    if (pEVar3 == (ExprBase *)0x0) break;
    bVar4 = false;
    if (pSVar1->breakDepth == 0) {
      bVar4 = pSVar1->continueDepth == 0;
    }
    if (!bVar4) {
      __assert_fail("frame->breakDepth == 0 && frame->continueDepth == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                    ,0xc53,"ExprBase *EvaluateModule(ExpressionEvalContext &, ExprModule *)");
    }
    if (pSVar1->returnValue != (ExprBase *)0x0) {
      return pSVar1->returnValue;
    }
    local_38 = local_38->next;
  }
  return (ExprBase *)0x0;
}

Assistant:

ExprBase* EvaluateModule(ExpressionEvalContext &ctx, ExprModule *expression)
{
	ctx.globalFrame = new (ctx.ctx.get<ExpressionEvalContext::StackFrame>()) ExpressionEvalContext::StackFrame(ctx.ctx.allocator, NULL);
	ctx.stackFrames.push_back(ctx.globalFrame);

	ExpressionEvalContext::StackFrame *frame = ctx.stackFrames.back();

	for(ExprBase *value = expression->setup.head; value; value = value->next)
	{
		if(!Evaluate(ctx, value))
			return NULL;
	}

	for(ExprBase *value = expression->expressions.head; value; value = value->next)
	{
		if(!Evaluate(ctx, value))
			return NULL;

		assert(frame->breakDepth == 0 && frame->continueDepth == 0);

		if(frame->returnValue)
			return frame->returnValue;
	}

	ctx.stackFrames.pop_back();

	assert(ctx.stackFrames.empty());

	return NULL;
}